

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* streamToEvents_abi_cxx11_
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,TestStream *input,char *eventFormat)

{
  Event *event;
  PrettyPrinter pp;
  EventStream eventStream;
  ostringstream str;
  string local_318;
  string local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  PrettyPrinter local_2b8;
  EventStream local_268;
  allocator local_1a8 [376];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  binlog::EventStream::EventStream(&local_268);
  std::__cxx11::string::string((string *)&local_2f8,eventFormat,local_1a8);
  std::__cxx11::string::string((string *)&local_318,"%Y.%m.%d %H:%M:%S",(allocator *)&local_2d8);
  binlog::PrettyPrinter::PrettyPrinter(&local_2b8,&local_2f8,&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_2f8);
  while( true ) {
    event = binlog::EventStream::nextEvent(&local_268,&input->super_EntryStream);
    if (event == (Event *)0x0) break;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    binlog::PrettyPrinter::printEvent
              (&local_2b8,(ostream *)local_1a8,event,&local_268._writerProp,&local_268._clockSync);
    std::__cxx11::stringbuf::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  }
  binlog::PrettyPrinter::~PrettyPrinter(&local_2b8);
  binlog::EventStream::~EventStream(&local_268);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> streamToEvents(TestStream& input, const char* eventFormat)
{
  std::vector<std::string> result;

  binlog::EventStream eventStream;
  binlog::PrettyPrinter pp(eventFormat, "%Y.%m.%d %H:%M:%S");

  while (const binlog::Event* event = eventStream.nextEvent(input))
  {
    std::ostringstream str;
    pp.printEvent(str, *event, eventStream.writerProp(), eventStream.clockSync());
    result.push_back(str.str());
  }

  return result;
}